

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_io.c
# Opt level: O1

int IDASetMaxOrd(void *ida_mem,int maxord)

{
  int iVar1;
  int iVar2;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    iVar2 = -0x14;
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    iVar1 = 0xdc;
  }
  else if (maxord < 1) {
    msgfmt = "maxord <= 0 illegal.";
    iVar2 = -0x16;
    error_code = -0x16;
    iVar1 = 0xe4;
  }
  else {
    if (maxord <= *(int *)((long)ida_mem + 0x30c)) {
      iVar1 = 5;
      if (maxord < 5) {
        iVar1 = maxord;
      }
      *(int *)((long)ida_mem + 0x308) = iVar1;
      return 0;
    }
    msgfmt = "Illegal attempt to increase maximum order.";
    iVar2 = -0x16;
    error_code = -0x16;
    iVar1 = 0xef;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,iVar1,"IDASetMaxOrd",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida_io.c"
                  ,msgfmt);
  return iVar2;
}

Assistant:

int IDASetMaxOrd(void* ida_mem, int maxord)
{
  IDAMem IDA_mem;
  int maxord_alloc;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  if (maxord <= 0)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_NEG_MAXORD);
    return (IDA_ILL_INPUT);
  }

  /* Cannot increase maximum order beyond the value that
     was used when allocating memory */
  maxord_alloc = IDA_mem->ida_maxord_alloc;

  if (maxord > maxord_alloc)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_MAXORD);
    return (IDA_ILL_INPUT);
  }

  IDA_mem->ida_maxord = SUNMIN(maxord, MAXORD_DEFAULT);

  return (IDA_SUCCESS);
}